

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-prefs.c
# Opt level: O1

parser_error parse_prefs_keymap_action(parser *p)

{
  _Bool _Var1;
  char *pcVar2;
  char *str;
  
  pcVar2 = (char *)parser_priv(p);
  if (pcVar2 != (char *)0x0) {
    if (*pcVar2 == '\0') {
      _Var1 = parser_hasval(p,"act");
      if (_Var1) {
        str = parser_getstr(p,"act");
      }
      else {
        str = "";
      }
      keypress_from_text((keypress *)(pcVar2 + 4),0x14,str);
    }
    return PARSE_ERROR_NONE;
  }
  __assert_fail("d != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/ui-prefs.c"
                ,0x3b4,"enum parser_error parse_prefs_keymap_action(struct parser *)");
}

Assistant:

static enum parser_error parse_prefs_keymap_action(struct parser *p)
{
	const char *act = "";

	struct prefs_data *d = parser_priv(p);	
	assert(d != NULL);
	if (d->bypass) return PARSE_ERROR_NONE;

	if (parser_hasval(p, "act")) {
		act = parser_getstr(p, "act");
	}
	keypress_from_text(d->keymap_buffer, N_ELEMENTS(d->keymap_buffer), act);

	return PARSE_ERROR_NONE;
}